

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.hpp
# Opt level: O2

void __thiscall helics::HandleManager::HandleManager(HandleManager *this)

{
  std::_Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::_Deque_base
            ((_Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)this)
  ;
  (this->publications)._M_h._M_buckets = &(this->publications)._M_h._M_single_bucket;
  (this->publications)._M_h._M_bucket_count = 1;
  (this->publications)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->publications)._M_h._M_element_count = 0;
  (this->publications)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->publications)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->publications)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->endpoints)._M_h._M_buckets = &(this->endpoints)._M_h._M_single_bucket;
  (this->endpoints)._M_h._M_bucket_count = 1;
  (this->endpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->endpoints)._M_h._M_element_count = 0;
  (this->endpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->endpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->endpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->inputs)._M_h._M_buckets = &(this->inputs)._M_h._M_single_bucket;
  (this->inputs)._M_h._M_bucket_count = 1;
  (this->inputs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs)._M_h._M_element_count = 0;
  (this->inputs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->filters)._M_h._M_buckets = &(this->filters)._M_h._M_single_bucket;
  (this->filters)._M_h._M_bucket_count = 1;
  (this->filters)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filters)._M_h._M_element_count = 0;
  (this->filters)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filters)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filters)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->unique_ids)._M_h._M_buckets = &(this->unique_ids)._M_h._M_single_bucket;
  (this->unique_ids)._M_h._M_bucket_count = 1;
  (this->unique_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->unique_ids)._M_h._M_element_count = 0;
  (this->unique_ids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->unique_ids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->unique_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->aliases)._M_h._M_buckets = &(this->aliases)._M_h._M_single_bucket;
  (this->aliases)._M_h._M_bucket_count = 1;
  (this->aliases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->aliases)._M_h._M_element_count = 0;
  (this->aliases)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->aliases)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->aliases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->alias_names)._M_h._M_buckets = &(this->alias_names)._M_h._M_single_bucket;
  (this->alias_names)._M_h._M_bucket_count = 1;
  (this->alias_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->alias_names)._M_h._M_element_count = 0;
  (this->alias_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->alias_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->alias_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

HandleManager() = default;